

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_gsub(lua_State *L)

{
  char cVar1;
  size_t *psVar2;
  lua_Integer lVar3;
  lua_State *in_RDI;
  char *e;
  luaL_Buffer b;
  MatchState ms;
  int n;
  int anchor;
  int max_s;
  int tr;
  char *p;
  char *src;
  size_t srcl;
  uint local_2274;
  size_t *in_stack_ffffffffffffdd90;
  size_t **in_stack_ffffffffffffdd98;
  luaL_Buffer *in_stack_ffffffffffffdda0;
  lua_State *in_stack_ffffffffffffdda8;
  char *in_stack_ffffffffffffddb0;
  luaL_Buffer *in_stack_ffffffffffffddb8;
  MatchState *in_stack_ffffffffffffddc0;
  char *in_stack_ffffffffffffddd8;
  char *in_stack_ffffffffffffdde0;
  MatchState *in_stack_ffffffffffffdde8;
  char *in_stack_ffffffffffffddf8;
  int in_stack_ffffffffffffde04;
  lua_State *in_stack_ffffffffffffde08;
  size_t *local_250;
  size_t *local_248;
  lua_State *local_240;
  undefined4 local_238;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  char *local_20;
  size_t *local_18;
  long local_10;
  lua_State *local_8;
  
  local_8 = in_RDI;
  local_18 = (size_t *)
             luaL_checklstring((lua_State *)in_stack_ffffffffffffdda0,
                               (int)((ulong)in_stack_ffffffffffffdd98 >> 0x20),
                               in_stack_ffffffffffffdd90);
  local_20 = luaL_checklstring((lua_State *)in_stack_ffffffffffffdda0,
                               (int)((ulong)in_stack_ffffffffffffdd98 >> 0x20),
                               in_stack_ffffffffffffdd90);
  local_24 = lua_type((lua_State *)in_stack_ffffffffffffdda0,
                      (int)((ulong)in_stack_ffffffffffffdd98 >> 0x20));
  lVar3 = luaL_optinteger((lua_State *)in_stack_ffffffffffffdda0,
                          (int)((ulong)in_stack_ffffffffffffdd98 >> 0x20),
                          (lua_Integer)in_stack_ffffffffffffdd90);
  local_28 = (int)lVar3;
  cVar1 = *local_20;
  if (cVar1 == '^') {
    local_20 = local_20 + 1;
  }
  local_2274 = (uint)(cVar1 == '^');
  local_2c = local_2274;
  local_30 = 0;
  if ((((local_24 != 3) && (local_24 != 4)) && (local_24 != 6)) && (local_24 != 5)) {
    luaL_argerror(in_stack_ffffffffffffde08,in_stack_ffffffffffffde04,in_stack_ffffffffffffddf8);
  }
  luaL_buffinit(local_8,(luaL_Buffer *)&stack0xffffffffffffdd98);
  local_240 = local_8;
  local_250 = local_18;
  local_248 = (size_t *)((long)local_18 + local_10);
  do {
    if (local_28 <= local_30) break;
    local_238 = 0;
    in_stack_ffffffffffffdd90 =
         (size_t *)
         match(in_stack_ffffffffffffdde8,in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8);
    if (in_stack_ffffffffffffdd90 != (size_t *)0x0) {
      local_30 = local_30 + 1;
      add_value(in_stack_ffffffffffffddc0,in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0,
                (char *)in_stack_ffffffffffffdda8);
    }
    if ((in_stack_ffffffffffffdd90 == (size_t *)0x0) ||
       (psVar2 = in_stack_ffffffffffffdd90, in_stack_ffffffffffffdd90 <= local_18)) {
      if (local_248 <= local_18) break;
      if (&local_250 <= in_stack_ffffffffffffdd98) {
        luaL_prepbuffer((luaL_Buffer *)0x11e396);
      }
      *(char *)in_stack_ffffffffffffdd98 = (char)*local_18;
      in_stack_ffffffffffffdd98 = (size_t **)((long)in_stack_ffffffffffffdd98 + 1);
      psVar2 = (size_t *)((long)local_18 + 1);
    }
    local_18 = psVar2;
  } while (local_2c == 0);
  luaL_addlstring(in_stack_ffffffffffffdda0,(char *)in_stack_ffffffffffffdd98,
                  (size_t)in_stack_ffffffffffffdd90);
  luaL_pushresult((luaL_Buffer *)0x11e417);
  lua_pushinteger(local_8,(long)local_30);
  return 2;
}

Assistant:

static int str_gsub(lua_State*L){
size_t srcl;
const char*src=luaL_checklstring(L,1,&srcl);
const char*p=luaL_checkstring(L,2);
int tr=lua_type(L,3);
int max_s=luaL_optint(L,4,srcl+1);
int anchor=(*p=='^')?(p++,1):0;
int n=0;
MatchState ms;
luaL_Buffer b;
luaL_argcheck(L,tr==3||tr==4||
tr==6||tr==5,3,
"string/function/table expected");
luaL_buffinit(L,&b);
ms.L=L;
ms.src_init=src;
ms.src_end=src+srcl;
while(n<max_s){
const char*e;
ms.level=0;
e=match(&ms,src,p);
if(e){
n++;
add_value(&ms,&b,src,e);
}
if(e&&e>src)
src=e;
else if(src<ms.src_end)
luaL_addchar(&b,*src++);
else break;
if(anchor)break;
}
luaL_addlstring(&b,src,ms.src_end-src);
luaL_pushresult(&b);
lua_pushinteger(L,n);
return 2;
}